

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O2

string * __thiscall
hanabi_learning_env::HanabiHand::CardKnowledge::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CardKnowledge *this)

{
  char cVar1;
  bool bVar2;
  int c;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar3 = (this->color_).value_;
  if (iVar3 < 0) {
    cVar1 = 'X';
  }
  else {
    cVar1 = ColorIndexToChar(iVar3);
  }
  std::operator+(&bStack_88,__return_storage_ptr__,cVar1);
  iVar3 = (this->rank_).value_;
  if (iVar3 < 0) {
    cVar1 = 'X';
  }
  else {
    cVar1 = RankIndexToChar(iVar3);
  }
  std::operator+(&local_68,&bStack_88,cVar1);
  std::operator+(&local_48,&local_68,'|');
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  for (iVar3 = 0;
      iVar3 < (int)((*(int *)&(this->color_).value_plausible_.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    *(int *)&(this->color_).value_plausible_.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                   *(uint *)((long)&(this->color_).value_plausible_.
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8)
                   ); iVar3 = iVar3 + 1) {
    bVar2 = ValueKnowledge::IsPlausible(&this->color_,iVar3);
    if (bVar2) {
      ColorIndexToChar(iVar3);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  for (iVar3 = 0;
      iVar3 < (int)((*(int *)&(this->rank_).value_plausible_.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    *(int *)&(this->rank_).value_plausible_.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
                   *(uint *)((long)&(this->rank_).value_plausible_.
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8)
                   ); iVar3 = iVar3 + 1) {
    bVar2 = ValueKnowledge::IsPlausible(&this->rank_,iVar3);
    if (bVar2) {
      RankIndexToChar(iVar3);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiHand::CardKnowledge::ToString() const {
  std::string result;
  result = result + (ColorHinted() ? ColorIndexToChar(Color()) : 'X') +
           (RankHinted() ? RankIndexToChar(Rank()) : 'X') + '|';
  for (int c = 0; c < color_.Range(); ++c) {
    if (color_.IsPlausible(c)) {
      result += ColorIndexToChar(c);
    }
  }
  for (int r = 0; r < rank_.Range(); ++r) {
    if (rank_.IsPlausible(r)) {
      result += RankIndexToChar(r);
    }
  }
  return result;
}